

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O1

short duckdb::DecimalScaleUpOperator::Operation<short,short>
                (short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  unkbyte10 Var2;
  short result;
  short local_3a;
  string local_38;
  
  bVar1 = TryCast::Operation<short,short>(input,&local_3a,false);
  if (bVar1) {
    return local_3a * *(short *)((long)dataptr + 0x22);
  }
  Var2 = __cxa_allocate_exception(0x10);
  CastExceptionText<short,short>
            (&local_38,(duckdb *)(ulong)(uint)(int)input,(short)((unkuint10)Var2 >> 0x40));
  InvalidInputException::InvalidInputException((InvalidInputException *)Var2,(string *)&local_38);
  __cxa_throw((InvalidInputException *)Var2,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}